

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_joinref.cpp
# Opt level: O2

BindingAlias * __thiscall
duckdb::Binder::FindBinding
          (BindingAlias *__return_storage_ptr__,Binder *this,string *using_column,string *join_side)

{
  bool bVar1;
  BinderException *this_00;
  allocator local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  BindingAlias::BindingAlias(__return_storage_ptr__);
  bVar1 = TryFindBinding(this,using_column,join_side,__return_storage_ptr__);
  if (bVar1) {
    return __return_storage_ptr__;
  }
  this_00 = (BinderException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_48,"Column \"%s\" does not exist on %s side of join!",&local_89);
  ::std::__cxx11::string::string((string *)&local_68,(string *)using_column);
  ::std::__cxx11::string::string((string *)&local_88,(string *)join_side);
  BinderException::BinderException<std::__cxx11::string,std::__cxx11::string>
            (this_00,&local_48,&local_68,&local_88);
  __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

BindingAlias Binder::FindBinding(const string &using_column, const string &join_side) {
	BindingAlias result;
	if (!TryFindBinding(using_column, join_side, result)) {
		throw BinderException("Column \"%s\" does not exist on %s side of join!", using_column, join_side);
	}
	return result;
}